

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

void dec_buf_mgr_deinit(DecBufMgr mgr)

{
  long lVar1;
  DecBufMgrImpl *impl;
  ulong uVar2;
  
  if (mgr != (DecBufMgr)0x0) {
    if (*(long *)((long)mgr + 0x10) != 0) {
      mpp_buffer_group_put();
      *(undefined8 *)((long)mgr + 0x10) = 0;
    }
    if ((*(int *)((long)mgr + 4) != 0) && (*(long *)((long)mgr + 0x18) != 0)) {
      if (*(int *)((long)mgr + 4) != 0) {
        uVar2 = 0;
        do {
          lVar1 = *(long *)(*(long *)((long)mgr + 0x18) + uVar2 * 8);
          if (lVar1 != 0) {
            mpp_buffer_put_with_caller(lVar1,"dec_buf_mgr_deinit");
            *(undefined8 *)(*(long *)((long)mgr + 0x18) + uVar2 * 8) = 0;
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < *(uint *)((long)mgr + 4));
      }
      if (*(long *)((long)mgr + 0x18) != 0) {
        mpp_osal_free("dec_buf_mgr_deinit");
      }
      *(undefined8 *)((long)mgr + 0x18) = 0;
    }
    mpp_osal_free("dec_buf_mgr_deinit",mgr);
    return;
  }
  return;
}

Assistant:

void dec_buf_mgr_deinit(DecBufMgr mgr)
{
    DecBufMgrImpl *impl = (DecBufMgrImpl *)mgr;

    if (NULL == impl)
        return;

    /* release buffer group for half internal and external mode */
    if (impl->group) {
        mpp_buffer_group_put(impl->group);
        impl->group = NULL;
    }

    /* release the buffers used in external mode */
    if (impl->buf_count && impl->bufs) {
        RK_U32 i;

        for (i = 0; i < impl->buf_count; i++) {
            if (impl->bufs[i]) {
                mpp_buffer_put(impl->bufs[i]);
                impl->bufs[i] = NULL;
            }
        }

        MPP_FREE(impl->bufs);
    }

    MPP_FREE(impl);
}